

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_199c2b::SwiftGetVersionCommand::execute
          (SwiftGetVersionCommand *this,BuildSystem *param_1,TaskInterface ti,
          QueueJobContext *context,ResultFn *resultFn)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  raw_ostream *prVar3;
  FILE *__stream;
  size_t sVar4;
  hash_code signature;
  void *__n;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  size_t sVar5;
  char *pcVar6;
  StringRef string;
  ArrayRef<llbuild::basic::FileInfo> outputInfos;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef S;
  raw_svector_ostream commandOS;
  SmallString<256U> command;
  SmallString<4096U> result;
  char buf [4096];
  raw_ostream local_21d8;
  undefined1 **local_21b0;
  FileInfo local_21a8;
  undefined1 *local_2158;
  undefined8 local_2150;
  undefined1 local_2148 [256];
  string local_2048 [128];
  BuildValue local_1038 [36];
  
  __n = ti.ctx;
  local_2150 = 0x10000000000;
  local_21d8.BufferMode = InternalBuffer;
  local_21d8.OutBufStart = (char *)0x0;
  local_21d8.OutBufEnd = (char *)0x0;
  local_21d8.OutBufCur = (char *)0x0;
  local_21d8._vptr_raw_ostream = (_func_int **)&PTR__raw_ostream_0020d3c0;
  local_21b0 = &local_2158;
  local_2158 = local_2148;
  llvm::raw_ostream::SetUnbuffered(&local_21d8);
  string.Length = (size_t)__n;
  string.Data = (char *)(this->executable)._M_string_length;
  llbuild::basic::shellEscaped_abi_cxx11_
            (local_2048,(basic *)(this->executable)._M_dataplus._M_p,string);
  llvm::raw_ostream::write
            (&local_21d8,(int)local_2048[0]._M_dataplus._M_p,(void *)local_2048[0]._M_string_length,
             (size_t)__n);
  paVar1 = &local_2048[0].field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2048[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_2048[0]._M_dataplus._M_p,
                    CONCAT71(local_2048[0].field_2._M_allocated_capacity._1_7_,
                             local_2048[0].field_2._M_local_buf[0]) + 1);
  }
  Str.Length = 1;
  Str.Data = " ";
  prVar3 = llvm::raw_ostream::operator<<(&local_21d8,Str);
  Str_00.Length = 9;
  Str_00.Data = "--version";
  llvm::raw_ostream::operator<<(prVar3,Str_00);
  Str_01.Length = 1;
  Str_01.Data = " ";
  prVar3 = llvm::raw_ostream::operator<<(&local_21d8,Str_01);
  Str_02.Length = 0xb;
  Str_02.Data = "2>/dev/null";
  llvm::raw_ostream::operator<<(prVar3,Str_02);
  puVar2 = *local_21b0;
  if (puVar2 == (undefined1 *)0x0) {
    local_2048[0]._M_dataplus._M_p = (pointer)&local_2048[0].field_2;
    local_2048[0]._M_string_length = 0;
    local_2048[0].field_2._M_local_buf[0] = '\0';
  }
  else {
    local_2048[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2048,puVar2,puVar2 + *(uint *)(local_21b0 + 1));
  }
  __stream = llbuild::basic::sys::popen(local_2048[0]._M_dataplus._M_p,"r");
  sVar5 = extraout_RDX;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2048[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_2048[0]._M_dataplus._M_p,
                    CONCAT71(local_2048[0].field_2._M_allocated_capacity._1_7_,
                             local_2048[0].field_2._M_local_buf[0]) + 1);
    sVar5 = extraout_RDX_00;
  }
  local_2048[0]._M_string_length = 0x100000000000;
  if (__stream == (FILE *)0x0) {
    pcVar6 = (char *)0x0;
    local_2048[0]._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_2048[0]._M_dataplus._M_p = (pointer)paVar1;
    sVar4 = fread(local_1038,1,0x1000,__stream);
    if (sVar4 != 0) {
      do {
        llvm::SmallVectorImpl<char>::append<char_const*,void>
                  ((SmallVectorImpl<char> *)local_2048,(char *)local_1038,
                   (char *)((long)&local_1038[0].kind + sVar4));
        sVar4 = fread(local_1038,1,0x1000,__stream);
      } while (sVar4 != 0);
    }
    llbuild::basic::sys::pclose(__stream);
    pcVar6 = (char *)(local_2048[0]._M_string_length & 0xffffffff);
    sVar5 = extraout_RDX_01;
  }
  local_21a8.checksum.bytes[0x10] = '\0';
  local_21a8.checksum.bytes[0x11] = '\0';
  local_21a8.checksum.bytes[0x12] = '\0';
  local_21a8.checksum.bytes[0x13] = '\0';
  local_21a8.checksum.bytes[0x14] = '\0';
  local_21a8.checksum.bytes[0x15] = '\0';
  local_21a8.checksum.bytes[0x16] = '\0';
  local_21a8.checksum.bytes[0x17] = '\0';
  local_21a8.checksum.bytes[0x18] = '\0';
  local_21a8.checksum.bytes[0x19] = '\0';
  local_21a8.checksum.bytes[0x1a] = '\0';
  local_21a8.checksum.bytes[0x1b] = '\0';
  local_21a8.checksum.bytes[0x1c] = '\0';
  local_21a8.checksum.bytes[0x1d] = '\0';
  local_21a8.checksum.bytes[0x1e] = '\0';
  local_21a8.checksum.bytes[0x1f] = '\0';
  local_21a8.checksum.bytes[0] = '\0';
  local_21a8.checksum.bytes[1] = '\0';
  local_21a8.checksum.bytes[2] = '\0';
  local_21a8.checksum.bytes[3] = '\0';
  local_21a8.checksum.bytes[4] = '\0';
  local_21a8.checksum.bytes[5] = '\0';
  local_21a8.checksum.bytes[6] = '\0';
  local_21a8.checksum.bytes[7] = '\0';
  local_21a8.checksum.bytes[8] = '\0';
  local_21a8.checksum.bytes[9] = '\0';
  local_21a8.checksum.bytes[10] = '\0';
  local_21a8.checksum.bytes[0xb] = '\0';
  local_21a8.checksum.bytes[0xc] = '\0';
  local_21a8.checksum.bytes[0xd] = '\0';
  local_21a8.checksum.bytes[0xe] = '\0';
  local_21a8.checksum.bytes[0xf] = '\0';
  local_21a8.modTime.seconds = 0;
  local_21a8.modTime.nanoseconds = 0;
  local_21a8.mode = 0;
  local_21a8.size = 0;
  local_21a8.device = 0;
  local_21a8.inode = 0;
  S.Length = sVar5;
  S.Data = pcVar6;
  signature = llvm::hash_value((llvm *)local_2048[0]._M_dataplus._M_p,S);
  outputInfos.Length = 1;
  outputInfos.Data = &local_21a8;
  llbuild::buildsystem::BuildValue::BuildValue
            (local_1038,SuccessfulCommandWithOutputSignature,outputInfos,
             (CommandSignature)signature.value);
  if ((resultFn->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*resultFn->_M_invoker)((_Any_data *)resultFn,local_1038);
    llbuild::buildsystem::BuildValue::~BuildValue(local_1038);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2048[0]._M_dataplus._M_p != paVar1) {
      free(local_2048[0]._M_dataplus._M_p);
    }
    llvm::raw_ostream::~raw_ostream(&local_21d8);
    if (local_2158 != local_2148) {
      free(local_2158);
    }
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

virtual void execute(BuildSystem&,
                       TaskInterface ti,
                       QueueJobContext* context,
                       ResultFn resultFn) override {
    // Construct the command line used to query the swift compiler version.
    //
    // FIXME: Need a decent subprocess interface.
    SmallString<256> command;
    llvm::raw_svector_ostream commandOS(command);
    commandOS << basic::shellEscaped(executable);
    commandOS << " " << "--version";
#if defined(_WIN32)
    // FIXME:  cmd.exe uses different syntax for I/O redirection to null.
    commandOS << " 2>NUL";
#else
    commandOS << " " << "2>/dev/null";
#endif

    // Read the result.
    FILE *fp = basic::sys::popen(commandOS.str().str().c_str(), "r");
    SmallString<4096> result;
    if (fp) {
      char buf[4096];
      for (;;) {
        ssize_t numRead = fread(buf, 1, sizeof(buf), fp);
        if (numRead == 0) {
          // FIXME: Error handling.
          break;
        }
        result.append(StringRef(buf, numRead));
      }
      basic::sys::pclose(fp);
    }

    // For now, we can get away with just encoding this as a successful
    // command and relying on the signature to detect changes.
    //
    // FIXME: We should support BuildValues with arbitrary payloads.
    resultFn(BuildValue::makeSuccessfulCommandWithOutputSignature(
       basic::FileInfo{}, CommandSignature(result)));
  }